

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_slice.c
# Opt level: O2

MPP_RET h264e_marking_wr_op(H264eMarkingInfo *info,H264eMmco *op)

{
  H264eMmco *pHVar1;
  int iVar2;
  RK_S32 RVar3;
  RK_S32 RVar4;
  RK_S32 RVar5;
  
  iVar2 = info->wr_cnt;
  if (iVar2 < info->size) {
    info->wr_cnt = iVar2 + 1;
    info->ops[iVar2].max_long_term_frame_idx_plus1 = op->max_long_term_frame_idx_plus1;
    RVar3 = op->difference_of_pic_nums_minus1;
    RVar4 = op->long_term_pic_num;
    RVar5 = op->long_term_frame_idx;
    pHVar1 = info->ops + iVar2;
    pHVar1->mmco = op->mmco;
    pHVar1->difference_of_pic_nums_minus1 = RVar3;
    pHVar1->long_term_pic_num = RVar4;
    pHVar1->long_term_frame_idx = RVar5;
    return MPP_OK;
  }
  _mpp_log_l(2,"h264e_slice","write too many mmco op %d vs %d\n","h264e_marking_wr_op");
  return MPP_NOK;
}

Assistant:

MPP_RET h264e_marking_wr_op(H264eMarkingInfo *info, H264eMmco *op)
{
    if (info->wr_cnt >= info->size) {
        mpp_err_f("write too many mmco op %d vs %d\n",
                  info->wr_cnt, info->size);
        return MPP_NOK;
    }

    info->ops[info->wr_cnt++] = *op;
    return MPP_OK;
}